

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O2

bool pd::prepareWord2vecInput
               (string *dir_name,string *out_filename,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *dict)

{
  key_type *__k;
  string *psVar1;
  bool bVar2;
  bool bVar3;
  reference p;
  ostream *poVar4;
  istream *piVar5;
  const_iterator cVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  string *psVar7;
  ostream local_4c0 [8];
  ofstream of;
  undefined1 local_2c0 [8];
  ifstream fi;
  uint auStack_2a0 [122];
  string local_b8 [8];
  path targetDir;
  string line;
  pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> local_70;
  uint local_5c;
  directory_iterator local_58;
  directory_iterator it;
  directory_iterator eod;
  directory_iterator local_38;
  
  line.field_2._8_8_ = dict;
  std::__cxx11::string::string(local_b8,(string *)dir_name);
  boost::filesystem::directory_iterator::directory_iterator(&local_58,(path *)local_b8,none);
  it.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  std::ofstream::ofstream(local_4c0,(string *)out_filename,_S_out);
  local_2c0 = (undefined1  [8])local_58.m_imp.px;
  if (local_58.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_58.m_imp.px = *(int *)local_58.m_imp.px + 1;
    UNLOCK();
  }
  _fi = (directory_iterator)(directory_iterator)it.m_imp.px;
  if (it.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
    UNLOCK();
  }
  local_70.first.m_imp.px = local_58.m_imp.px;
  if (local_58.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_58.m_imp.px = *(int *)local_58.m_imp.px + 1;
    UNLOCK();
  }
  local_70.second = (directory_iterator)(directory_iterator)it.m_imp.px;
  if (it.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
    UNLOCK();
  }
  std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>::~pair
            ((pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> *)
             local_2c0);
  boost::foreach_detail_::
  begin<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
            ((auto_any_t)&local_38,
             (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
              *)&local_70,(true_ *)0x0);
  boost::foreach_detail_::
  end<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
            ((auto_any_t)&eod,
             (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
              *)&local_70,(true_ *)0x0);
  bVar2 = true;
  __k = (key_type *)(targetDir.m_pathname.field_2._M_local_buf + 8);
  while (bVar2) {
    bVar2 = boost::filesystem::directory_iterator::equal(&local_38,&eod);
    if (bVar2) break;
    p = boost::filesystem::directory_iterator::dereference(&local_38);
    bVar2 = false;
LAB_0012e6a1:
    if (!bVar2) {
      bVar2 = boost::filesystem::is_regular_file((path *)p);
      if (bVar2) goto LAB_0012e6bc;
      goto LAB_0012e800;
    }
    boost::filesystem::directory_iterator::increment(&local_38);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&eod.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_38.m_imp);
  bVar2 = true;
LAB_0012e848:
  std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>::~pair
            (&local_70);
  std::ofstream::~ofstream(local_4c0);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&it.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_58.m_imp);
  std::__cxx11::string::~string(local_b8);
  return bVar2;
LAB_0012e6bc:
  boost::filesystem::path::extension();
  bVar3 = boost::filesystem::operator==((path *)local_2c0,"swp");
  std::__cxx11::string::~string((string *)local_2c0);
  bVar2 = true;
  if (!bVar3) {
    std::ifstream::ifstream(local_2c0,(string *)p,_S_in);
    local_5c = *(uint *)((long)auStack_2a0 + *(long *)((long)local_2c0 + -0x18));
    if ((local_5c & 5) == 0) {
      targetDir.m_pathname.field_2._8_8_ = &line._M_string_length;
      line._M_dataplus._M_p = (pointer)0x0;
      line._M_string_length._0_1_ = 0;
      while( true ) {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_2c0,(string *)__k);
        if ((((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) ||
           (line._M_dataplus._M_p == (pointer)0x0)) break;
        std::operator<<(local_4c0,(string *)__k);
        cVar6 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)line.field_2._8_8_,__k);
        if (cVar6.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          psVar1 = *(string **)
                    ((long)cVar6.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
                           ._M_cur + 0x30);
          for (psVar7 = *(string **)
                         ((long)cVar6.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
                                ._M_cur + 0x28); psVar7 != psVar1; psVar7 = psVar7 + 0x20) {
            poVar4 = std::operator<<(local_4c0," ");
            std::operator<<(poVar4,psVar7);
          }
          std::operator<<(local_4c0," ");
        }
      }
      std::__cxx11::string::~string((string *)__k);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"File ");
      poVar4 = std::operator<<(poVar4,(string *)p);
      poVar4 = std::operator<<(poVar4,"doesn\'t exist");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    std::ifstream::~ifstream(local_2c0);
    if ((local_5c & 5) != 0) {
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&eod.m_imp);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_38.m_imp);
      bVar2 = false;
      goto LAB_0012e848;
    }
LAB_0012e800:
    bVar2 = true;
    std::endl<char,std::char_traits<char>>(local_4c0);
  }
  goto LAB_0012e6a1;
}

Assistant:

bool prepareWord2vecInput(const std::string& dir_name, const std::string& out_filename, const std::unordered_map<std::string, std::vector<std::string>>& dict)
    {
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        std::ofstream of(out_filename);
        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                //std::cout << p.string() << std::endl;
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                while (std::getline(fi, line) and !line.empty())
                {
                    of << line;
                    std::unordered_map<std::string, std::vector<std::string>>::const_iterator it = dict.find(line);
                    if (it == dict.end())
                        continue;
                    
                    for (const auto& s: it->second)
                    {
                        of << " " << s;
                    }
                    of << " ";
                }                
            }
            of << std::endl; 
        }
        return true;
    }